

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::SerializeWithCachedSizes
          (UniDirectionalLSTMLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  uint64 uVar3;
  ActivationParams *value;
  uint local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  UniDirectionalLSTMLayerParams *this_local;
  
  uVar3 = inputvectorsize(this);
  if (uVar3 != 0) {
    uVar3 = inputvectorsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar3,output);
  }
  uVar3 = outputvectorsize(this);
  if (uVar3 != 0) {
    uVar3 = outputvectorsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar3,output);
  }
  local_20 = 0;
  uVar2 = activations_size(this);
  for (; local_20 < uVar2; local_20 = local_20 + 1) {
    value = activations(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(10,&value->super_MessageLite,output);
  }
  bVar1 = has_params(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xf,&this->params_->super_MessageLite,output);
  }
  bVar1 = has_weightparams(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&this->weightparams_->super_MessageLite,output);
  }
  bVar1 = reverseinput(this);
  if (bVar1) {
    bVar1 = reverseinput(this);
    google::protobuf::internal::WireFormatLite::WriteBool(100,bVar1,output);
  }
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->inputvectorsize(), output);
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->outputvectorsize(), output);
  }

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  for (unsigned int i = 0, n = this->activations_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, this->activations(i), output);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->has_params()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      15, *this->params_, output);
  }

  // .CoreML.Specification.LSTMWeightParams weightParams = 20;
  if (this->has_weightparams()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *this->weightparams_, output);
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(100, this->reverseinput(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.UniDirectionalLSTMLayerParams)
}